

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestObject::TestObject(TestObject *this)

{
  Fault local_18;
  Fault f;
  TestObject *this_local;
  
  this->index = (anonymous_namespace)::TestObject::count;
  if (this->index != (anonymous_namespace)::TestObject::throwAt) {
    (anonymous_namespace)::TestObject::count = (anonymous_namespace)::TestObject::count + 1;
    return;
  }
  f.exception = (Exception *)this;
  _::Debug::Fault::Fault
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
             ,0x21,FAILED,"index != throwAt","");
  _::Debug::Fault::fatal(&local_18);
}

Assistant:

TestObject() {
    index = count;
    KJ_ASSERT(index != throwAt);
    ++count;
  }